

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int blobReadWrite(sqlite3_blob *pBlob,void *z,int n,int iOffset,
                 _func_int_BtCursor_ptr_u32_u32_void_ptr *xCall)

{
  int *piVar1;
  sqlite3 *db;
  Vdbe *p;
  Btree *pBVar2;
  uint uVar3;
  uint uVar4;
  BtCursor *pBVar5;
  
  if (pBlob == (sqlite3_blob *)0x0) {
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1633e,
                "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
    return 0x15;
  }
  db = *(sqlite3 **)(pBlob + 0x20);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  uVar4 = 1;
  if (((iOffset | n) < 0) || ((long)*(int *)pBlob < (long)((ulong)(uint)n + (ulong)(uint)iOffset)))
  {
LAB_00127f76:
    db->errCode = uVar4;
    uVar3 = uVar4;
  }
  else {
    p = *(Vdbe **)(pBlob + 0x18);
    uVar4 = 4;
    if (p == (Vdbe *)0x0) goto LAB_00127f76;
    pBVar5 = *(BtCursor **)(pBlob + 0x10);
    pBVar2 = pBVar5->pBtree;
    if ((pBVar2->sharable != '\0') &&
       (pBVar2->wantToLock = pBVar2->wantToLock + 1, pBVar2->locked == '\0')) {
      btreeLockCarefully(pBVar2);
      pBVar5 = *(BtCursor **)(pBlob + 0x10);
    }
    uVar3 = (*xCall)(pBVar5,iOffset + *(int *)(pBlob + 4),n,z);
    pBVar2 = *(Btree **)(*(long *)(pBlob + 0x10) + 8);
    if (pBVar2->sharable != '\0') {
      piVar1 = &pBVar2->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(pBVar2);
      }
    }
    if (uVar3 == 4) {
      sqlite3VdbeFinalize(p);
      *(undefined8 *)(pBlob + 0x18) = 0;
      goto LAB_00127f76;
    }
    p->rc = uVar3;
    db->errCode = uVar3;
    if ((uVar3 == 0) && (uVar3 = 0, db->pErr == (sqlite3_value *)0x0)) goto LAB_00127f84;
  }
  sqlite3ErrorFinish(db,uVar3);
LAB_00127f84:
  if ((uVar3 == 0xc0a) || (db->mallocFailed != '\0')) {
    apiOomError(db);
    uVar3 = 7;
  }
  else {
    uVar3 = uVar3 & db->errMask;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar3;
}

Assistant:

static int blobReadWrite(
  sqlite3_blob *pBlob, 
  void *z, 
  int n, 
  int iOffset, 
  int (*xCall)(BtCursor*, u32, u32, void*)
){
  int rc;
  Incrblob *p = (Incrblob *)pBlob;
  Vdbe *v;
  sqlite3 *db;

  if( p==0 ) return SQLITE_MISUSE_BKPT;
  db = p->db;
  sqlite3_mutex_enter(db->mutex);
  v = (Vdbe*)p->pStmt;

  if( n<0 || iOffset<0 || ((sqlite3_int64)iOffset+n)>p->nByte ){
    /* Request is out of range. Return a transient error. */
    rc = SQLITE_ERROR;
  }else if( v==0 ){
    /* If there is no statement handle, then the blob-handle has
    ** already been invalidated. Return SQLITE_ABORT in this case.
    */
    rc = SQLITE_ABORT;
  }else{
    /* Call either BtreeData() or BtreePutData(). If SQLITE_ABORT is
    ** returned, clean-up the statement handle.
    */
    assert( db == v->db );
    sqlite3BtreeEnterCursor(p->pCsr);

#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    if( xCall==sqlite3BtreePutData && db->xPreUpdateCallback ){
      /* If a pre-update hook is registered and this is a write cursor, 
      ** invoke it here. 
      ** 
      ** TODO: The preupdate-hook is passed SQLITE_DELETE, even though this
      ** operation should really be an SQLITE_UPDATE. This is probably
      ** incorrect, but is convenient because at this point the new.* values 
      ** are not easily obtainable. And for the sessions module, an 
      ** SQLITE_UPDATE where the PK columns do not change is handled in the 
      ** same way as an SQLITE_DELETE (the SQLITE_DELETE code is actually
      ** slightly more efficient). Since you cannot write to a PK column
      ** using the incremental-blob API, this works. For the sessions module
      ** anyhow.
      */
      sqlite3_int64 iKey;
      iKey = sqlite3BtreeIntegerKey(p->pCsr);
      sqlite3VdbePreUpdateHook(
          v, v->apCsr[0], SQLITE_DELETE, p->zDb, p->pTab, iKey, -1
      );
    }
#endif

    rc = xCall(p->pCsr, iOffset+p->iOffset, n, z);
    sqlite3BtreeLeaveCursor(p->pCsr);
    if( rc==SQLITE_ABORT ){
      sqlite3VdbeFinalize(v);
      p->pStmt = 0;
    }else{
      v->rc = rc;
    }
  }
  sqlite3Error(db, rc);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}